

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Promise<void> __thiscall capnp::ClientHook::whenResolved(ClientHook *this)

{
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *other;
  Promise<kj::Own<capnp::ClientHook>_> *pPVar1;
  Type *func;
  PromiseNode *extraout_RDX;
  long *in_RSI;
  Promise<void> PVar2;
  PropagateException local_55 [13];
  Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_> local_48;
  undefined1 local_30 [8];
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> promise;
  ClientHook *this_local;
  
  (**(code **)(*in_RSI + 0x18))();
  other = kj::_::readMaybe<kj::Promise<kj::Own<capnp::ClientHook>>>(&local_48);
  kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::NullableValue
            ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)local_30,other);
  kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_>::~Maybe(&local_48);
  pPVar1 = kj::_::NullableValue::operator_cast_to_Promise_((NullableValue *)local_30);
  if (pPVar1 == (Promise<kj::Own<capnp::ClientHook>_> *)0x0) {
    kj::Promise<void>::Promise((Promise<void> *)this);
  }
  else {
    func = (Type *)kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::operator->
                             ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)local_30);
    kj::Promise<kj::Own<capnp::ClientHook>>::
    then<capnp::ClientHook::whenResolved()::__0,kj::_::PropagateException>
              ((Promise<kj::Own<capnp::ClientHook>> *)this,func,local_55);
  }
  kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::~NullableValue
            ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)local_30);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> ClientHook::whenResolved() {
  KJ_IF_MAYBE(promise, whenMoreResolved()) {
    return promise->then([](kj::Own<ClientHook>&& resolution) {
      return resolution->whenResolved();
    });
  } else {
    return kj::READY_NOW;
  }